

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O0

int print_bool(int n,char *buf)

{
  char *buf_local;
  int n_local;
  
  if (n == 0) {
    builtin_strncpy(buf,"false",6);
    buf_local._4_4_ = 5;
  }
  else {
    builtin_strncpy(buf,"true",5);
    buf_local._4_4_ = 4;
  }
  return buf_local._4_4_;
}

Assistant:

static int print_bool(int n, char *buf)
{
    if (n) {
        memcpy(buf, "true\0", 5);
        return 4;
    } else {
        memcpy(buf, "false\0", 6);
        return 5;
    }
}